

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode http_perhapsrewind(connectdata *conn)

{
  Curl_HttpReq CVar1;
  uint uVar2;
  Curl_easy *data;
  void *pvVar3;
  long lVar4;
  unsigned_long uVar5;
  CURLcode CVar6;
  curl_off_t *pcVar7;
  curl_off_t cVar8;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  if (pvVar3 == (void *)0x0) {
    return CURLE_OK;
  }
  CVar1 = (data->set).httpreq;
  if (CVar1 == HTTPREQ_GET) {
    return CURLE_OK;
  }
  if (CVar1 == HTTPREQ_HEAD) {
    return CURLE_OK;
  }
  lVar4 = (data->req).writebytecount;
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar2 & 0x9000) == 0x1000) {
    if (CVar1 - HTTPREQ_POST_FORM < 2) {
      pcVar7 = (curl_off_t *)((long)pvVar3 + 8);
    }
    else {
      if ((CVar1 != HTTPREQ_PUT) && (cVar8 = -1, CVar1 != HTTPREQ_POST)) goto LAB_00111c71;
      pcVar7 = &(data->state).infilesize;
    }
    cVar8 = *pcVar7;
  }
  else {
    cVar8 = 0;
  }
LAB_00111c71:
  *(uint *)&(conn->bits).field_0x4 = uVar2 & 0xfffeffff;
  if (lVar4 < cVar8 || cVar8 == -1) {
    uVar5 = (data->state).authproxy.picked;
    if ((((uVar5 == 8) || (uVar5 == 0x20)) || (uVar5 = (data->state).authhost.picked, uVar5 == 0x20)
        ) || (uVar5 == 8)) {
      if (((cVar8 - lVar4 < 2000) || (conn->http_ntlm_state != NTLMSTATE_NONE)) ||
         (conn->proxy_ntlm_state != NTLMSTATE_NONE)) {
        if ((short)uVar2 < 0) {
          return CURLE_OK;
        }
        if (conn->writesockfd == -1) {
          return CURLE_OK;
        }
        *(uint *)&(conn->bits).field_0x4 = uVar2 | 0x10000;
        Curl_infof(data,"Rewind stream after send\n");
        return CURLE_OK;
      }
      if ((uVar2 & 1) != 0) {
        return CURLE_OK;
      }
      Curl_infof(data,"NTLM send, close instead of sending %ld bytes\n");
    }
    Curl_conncontrol(conn,2);
    (data->req).size = 0;
  }
  if (lVar4 == 0) {
    return CURLE_OK;
  }
  CVar6 = Curl_readrewind(conn);
  return CVar6;
}

Assistant:

static CURLcode http_perhapsrewind(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
  curl_off_t bytessent;
  curl_off_t expectsend = -1; /* default is unknown */

  if(!http)
    /* If this is still NULL, we have not reach very far and we can safely
       skip this rewinding stuff */
    return CURLE_OK;

  switch(data->set.httpreq) {
  case HTTPREQ_GET:
  case HTTPREQ_HEAD:
    return CURLE_OK;
  default:
    break;
  }

  bytessent = data->req.writebytecount;

  if(conn->bits.authneg) {
    /* This is a state where we are known to be negotiating and we don't send
       any data then. */
    expectsend = 0;
  }
  else if(!conn->bits.protoconnstart) {
    /* HTTP CONNECT in progress: there is no body */
    expectsend = 0;
  }
  else {
    /* figure out how much data we are expected to send */
    switch(data->set.httpreq) {
    case HTTPREQ_POST:
      if(data->state.infilesize != -1)
        expectsend = data->state.infilesize;
      break;
    case HTTPREQ_PUT:
      if(data->state.infilesize != -1)
        expectsend = data->state.infilesize;
      break;
    case HTTPREQ_POST_FORM:
    case HTTPREQ_POST_MIME:
      expectsend = http->postsize;
      break;
    default:
      break;
    }
  }

  conn->bits.rewindaftersend = FALSE; /* default */

  if((expectsend == -1) || (expectsend > bytessent)) {
#if defined(USE_NTLM)
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NTLM) ||
       (data->state.authhost.picked == CURLAUTH_NTLM) ||
       (data->state.authproxy.picked == CURLAUTH_NTLM_WB) ||
       (data->state.authhost.picked == CURLAUTH_NTLM_WB)) {
      if(((expectsend - bytessent) < 2000) ||
         (conn->http_ntlm_state != NTLMSTATE_NONE) ||
         (conn->proxy_ntlm_state != NTLMSTATE_NONE)) {
        /* The NTLM-negotiation has started *OR* there is just a little (<2K)
           data left to send, keep on sending. */

        /* rewind data when completely done sending! */
        if(!conn->bits.authneg && (conn->writesockfd != CURL_SOCKET_BAD)) {
          conn->bits.rewindaftersend = TRUE;
          infof(data, "Rewind stream after send\n");
        }

        return CURLE_OK;
      }

      if(conn->bits.close)
        /* this is already marked to get closed */
        return CURLE_OK;

      infof(data, "NTLM send, close instead of sending %"
            CURL_FORMAT_CURL_OFF_T " bytes\n",
            (curl_off_t)(expectsend - bytessent));
    }
#endif
#if defined(USE_SPNEGO)
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NEGOTIATE) ||
       (data->state.authhost.picked == CURLAUTH_NEGOTIATE)) {
      if(((expectsend - bytessent) < 2000) ||
         (conn->http_negotiate_state != GSS_AUTHNONE) ||
         (conn->proxy_negotiate_state != GSS_AUTHNONE)) {
        /* The NEGOTIATE-negotiation has started *OR*
        there is just a little (<2K) data left to send, keep on sending. */

        /* rewind data when completely done sending! */
        if(!conn->bits.authneg && (conn->writesockfd != CURL_SOCKET_BAD)) {
          conn->bits.rewindaftersend = TRUE;
          infof(data, "Rewind stream after send\n");
        }

        return CURLE_OK;
      }

      if(conn->bits.close)
        /* this is already marked to get closed */
        return CURLE_OK;

      infof(data, "NEGOTIATE send, close instead of sending %"
        CURL_FORMAT_CURL_OFF_T " bytes\n",
        (curl_off_t)(expectsend - bytessent));
    }
#endif

    /* This is not NEGOTIATE/NTLM or many bytes left to send: close */
    streamclose(conn, "Mid-auth HTTP and much data left to send");
    data->req.size = 0; /* don't download any more than 0 bytes */

    /* There still is data left to send, but this connection is marked for
       closure so we can safely do the rewind right now */
  }

  if(bytessent)
    /* we rewind now at once since if we already sent something */
    return Curl_readrewind(conn);

  return CURLE_OK;
}